

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime.c
# Opt level: O2

void * helper_lookup_tb_ptr_ppc(CPUArchState_conflict21 *env)

{
  uint pc;
  uint32_t flags;
  _func_void_DisasContext_ptr_int_int *p_Var1;
  _func_void_DisasContext_ptr_int_int *p_Var2;
  TranslationBlock_conflict *pTVar3;
  tb_tc *ptVar4;
  uint32_t cf_mask;
  uint uVar5;
  ulong uVar6;
  
  p_Var1 = env[-1].spr_cb[0x3be].oea_read;
  p_Var2 = env[-1].spr_cb[0x1bc].oea_read;
  pc = *(uint *)(p_Var2 + 0x160);
  flags = *(uint32_t *)(p_Var2 + 0x118fc);
  uVar5 = pc >> 6 ^ pc;
  uVar6 = (ulong)(uVar5 & 0x3f | uVar5 >> 6 & 0xfc0);
  pTVar3 = *(TranslationBlock_conflict **)((long)env + uVar6 * 8 + -0x9c38);
  cf_mask = *(int *)&env[-1].spr_cb[0x3bd].field_0x3c << 0x18;
  if ((((pTVar3 == (TranslationBlock_conflict *)0x0) || (pTVar3->pc != pc)) ||
      (pTVar3->cs_base != 0)) ||
     (((pTVar3->flags != flags ||
       (env[-1].spr_cb[0x3bd].name != (char *)(ulong)pTVar3->trace_vcpu_dstate)) ||
      ((pTVar3->cflags & 0xff0effff) != cf_mask)))) {
    pTVar3 = tb_htable_lookup_ppc
                       ((CPUState_conflict *)&env[-1].spr_cb[0x1b7].hea_write,pc,0,flags,cf_mask);
    if (pTVar3 == (TranslationBlock_conflict *)0x0) {
      ptVar4 = (tb_tc *)(*(long *)(p_Var1 + 0x2e8) + 0x98);
      goto LAB_00940e25;
    }
    *(TranslationBlock_conflict **)((long)env + uVar6 * 8 + -0x9c38) = pTVar3;
  }
  ptVar4 = &pTVar3->tc;
LAB_00940e25:
  return ptVar4->ptr;
}

Assistant:

void *HELPER(lookup_tb_ptr)(CPUArchState *env)
{
    CPUState *cpu = env_cpu(env);
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    uint32_t flags;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;

    tb = tb_lookup__cpu_state(cpu, &pc, &cs_base, &flags, curr_cflags());
    if (tb == NULL) {
        return uc->tcg_ctx->code_gen_epilogue;
    }
    return tb->tc.ptr;
}